

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O3

UChar * u_strncpy_63(UChar *dst,UChar *src,int32_t n)

{
  short sVar1;
  bool bVar2;
  long lVar3;
  UChar *anchor;
  
  if (0 < n) {
    lVar3 = 0;
    do {
      sVar1 = *(short *)((long)src + lVar3);
      *(short *)((long)dst + lVar3) = sVar1;
      if (sVar1 == 0) {
        return dst;
      }
      lVar3 = lVar3 + 2;
      bVar2 = 1 < (uint)n;
      n = n - 1;
    } while (bVar2);
  }
  return dst;
}

Assistant:

U_CAPI UChar*  U_EXPORT2
u_strncpy(UChar     *dst, 
     const UChar     *src, 
     int32_t     n) 
{
    UChar *anchor = dst;            /* save a pointer to start of dst */

    /* copy string 2 over */
    while(n > 0 && (*(dst++) = *(src++)) != 0) {
        --n;
    }

    return anchor;
}